

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BinaryFileFormat.cpp
# Opt level: O2

ssize_t __thiscall pbrt::BinaryReader::read(BinaryReader *this,int __fd,void *__buf,size_t __nbytes)

{
  ssize_t extraout_RAX;
  undefined4 in_register_00000034;
  int32_t size;
  undefined1 *local_40 [2];
  undefined1 local_30 [16];
  
  read<int,void>(this,&size);
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct((ulong)local_40,(char)size);
  std::__cxx11::string::operator=((string *)CONCAT44(in_register_00000034,__fd),(string *)local_40);
  std::__cxx11::string::~string((string *)local_40);
  copyBytes<char>(this,*(char **)CONCAT44(in_register_00000034,__fd),(long)size);
  return extraout_RAX;
}

Assistant:

void read(std::string &t)
    {
      int32_t size;
      read(size);
      t = std::string(size,' ');
      copyBytes(t.data(),size);
    }